

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

MSize crec_copy_unroll(CRecMemList *ml,CTSize len,CTSize step,IRType tp)

{
  int iVar1;
  uint local_2c;
  uint local_28;
  MSize mlp;
  CTSize ofs;
  IRType tp_local;
  CTSize step_local;
  CTSize len_local;
  CRecMemList *ml_local;
  
  local_28 = 0;
  local_2c = 0;
  ofs = step;
  mlp = tp;
  if (tp == IRT_CDATA) {
    iVar1 = 0x1f;
    if (step != 0) {
      for (; step >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    mlp = iVar1 * 2 + 0x10;
  }
  do {
    for (; local_28 + ofs <= len; local_28 = ofs + local_28) {
      if (0xf < local_2c) {
        return 0;
      }
      ml[local_2c].ofs = local_28;
      ml[local_2c].tp = mlp;
      local_2c = local_2c + 1;
    }
    ofs = ofs >> 1;
    mlp = mlp - 2;
  } while (local_28 < len);
  return local_2c;
}

Assistant:

static MSize crec_copy_unroll(CRecMemList *ml, CTSize len, CTSize step,
			      IRType tp)
{
  CTSize ofs = 0;
  MSize mlp = 0;
  if (tp == IRT_CDATA) tp = IRT_U8 + 2*lj_fls(step);
  do {
    while (ofs + step <= len) {
      if (mlp >= CREC_COPY_MAXUNROLL) return 0;
      ml[mlp].ofs = ofs;
      ml[mlp].tp = tp;
      mlp++;
      ofs += step;
    }
    step >>= 1;
    tp -= 2;
  } while (ofs < len);
  return mlp;
}